

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv2maropu.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  ostream *poVar2;
  char *__filename;
  size_t sVar3;
  reference pvVar4;
  int iVar5;
  long in_RSI;
  char *pcVar6;
  int in_EDI;
  uint32_t tsize;
  uint32_t counter;
  size_t block;
  uint32_t MAXSIZE;
  FILE *fd;
  vector<unsigned_int,_std::allocator<unsigned_int>_> container;
  size_t integers;
  size_t N;
  size_t c;
  CSVFlatFile cvs;
  string ofilename;
  string ifilename;
  CSVFlatFile *in_stack_fffffffffffffbc0;
  ostream *in_stack_fffffffffffffbd0;
  size_type in_stack_fffffffffffffbd8;
  undefined7 in_stack_fffffffffffffbe0;
  undefined1 in_stack_fffffffffffffbe7;
  CSVFlatFile *in_stack_fffffffffffffbe8;
  undefined8 in_stack_fffffffffffffc20;
  char *in_stack_fffffffffffffc28;
  CSVFlatFile *in_stack_fffffffffffffc30;
  undefined4 local_380;
  uint local_37c;
  ulong local_378;
  uint local_370 [2];
  FILE *local_368;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_358;
  ulong local_340;
  size_t local_338;
  size_t local_330;
  CSVFlatFile local_328;
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  long local_10;
  int local_4;
  
  iVar5 = (int)((ulong)in_stack_fffffffffffffc20 >> 0x20);
  local_4 = 0;
  if (in_EDI < 3) {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             " This will map a table (stored in a CSV file) to a row  oriented flat file of frequency attributed 32-bit integers "
                            );
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             " usage : cvs2maropu mycvsfile.cvs mymaropufile.bin ");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    local_4 = -1;
  }
  else {
    pcVar6 = *(char **)(in_RSI + 8);
    local_10 = in_RSI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,pcVar6,&local_31);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    pcVar6 = *(char **)(local_10 + 0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,pcVar6,&local_69);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    std::__cxx11::string::c_str();
    FastPForLib::CSVFlatFile::CSVFlatFile(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,iVar5)
    ;
    local_330 = FastPForLib::CSVFlatFile::getNumberOfColumns((CSVFlatFile *)0x102767);
    local_338 = FastPForLib::CSVFlatFile::getNumberOfRows(&local_328);
    local_340 = (ulong)(uint)((int)local_330 * (int)local_338);
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x1027e6);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0),
               in_stack_fffffffffffffbd8,(allocator_type *)in_stack_fffffffffffffbd0);
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x102812);
    __filename = (char *)std::__cxx11::string::c_str();
    pcVar6 = "w+b";
    local_368 = fopen(__filename,"w+b");
    if (local_368 == (FILE *)0x0) {
      poVar2 = std::operator<<((ostream *)&std::cout," could not open ");
      poVar2 = std::operator<<(poVar2,local_68);
      poVar2 = std::operator<<(poVar2," for writing...");
      iVar5 = 0x114068;
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      FastPForLib::CSVFlatFile::close(&local_328,iVar5);
      local_4 = -1;
      local_370[1] = 1;
    }
    else {
      local_370[0] = (uint)(local_330 << 0x14);
      local_378 = 0;
      for (; iVar5 = (int)pcVar6, local_340 <= local_378 * local_370[0];
          local_340 = local_340 - local_370[0]) {
        sVar3 = fwrite(local_370,4,1,local_368);
        if (sVar3 != 1) {
          poVar2 = std::operator<<((ostream *)&std::cerr,"aborting");
          iVar5 = 0x114068;
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          fclose(local_368);
          FastPForLib::CSVFlatFile::close(&local_328,iVar5);
          local_4 = -1;
          local_370[1] = 1;
          goto LAB_00102dc2;
        }
        local_37c = 0;
        do {
          pcVar6 = (char *)&local_358;
          bVar1 = FastPForLib::CSVFlatFile::
                  nextRow<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                            (in_stack_fffffffffffffbe8,
                             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                             CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0));
          if (!bVar1) break;
          pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (&local_358,0);
          pcVar6 = (char *)(local_330 << 2);
          sVar3 = fwrite(pvVar4,(size_t)pcVar6,1,local_368);
          if (sVar3 != 1) {
            poVar2 = std::operator<<((ostream *)&std::cerr,"aborting");
            iVar5 = 0x114068;
            std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
            fclose(local_368);
            FastPForLib::CSVFlatFile::close(&local_328,iVar5);
            local_4 = -1;
            local_370[1] = 1;
            goto LAB_00102dc2;
          }
          local_37c = (int)local_330 + local_37c;
        } while (local_37c != local_378);
      }
      if (local_340 == 0) {
LAB_00102d3d:
        fclose(local_368);
        FastPForLib::CSVFlatFile::close(&local_328,iVar5);
        poVar2 = std::operator<<((ostream *)&std::cout,"#file ");
        in_stack_fffffffffffffbc0 = (CSVFlatFile *)std::operator<<(poVar2,local_68);
        poVar2 = std::operator<<((ostream *)in_stack_fffffffffffffbc0," contains your data.");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        local_370[1] = 0;
      }
      else {
        local_380 = (undefined4)local_340;
        sVar3 = fwrite(&local_380,4,1,local_368);
        if (sVar3 == 1) {
          do {
            iVar5 = (int)&local_358;
            in_stack_fffffffffffffbe7 =
                 FastPForLib::CSVFlatFile::
                 nextRow<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                           (in_stack_fffffffffffffbe8,
                            (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0));
            if (!(bool)in_stack_fffffffffffffbe7) goto LAB_00102d3d;
            pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               (&local_358,0);
            sVar3 = fwrite(pvVar4,local_330 << 2,1,local_368);
          } while (sVar3 == 1);
          in_stack_fffffffffffffbd0 = std::operator<<((ostream *)&std::cerr,"aborting");
          iVar5 = 0x114068;
          std::ostream::operator<<(in_stack_fffffffffffffbd0,std::endl<char,std::char_traits<char>>)
          ;
          fclose(local_368);
          FastPForLib::CSVFlatFile::close(&local_328,iVar5);
          local_4 = -1;
          local_370[1] = 1;
        }
        else {
          poVar2 = std::operator<<((ostream *)&std::cerr,"aborting");
          iVar5 = 0x114068;
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          fclose(local_368);
          FastPForLib::CSVFlatFile::close(&local_328,iVar5);
          local_4 = -1;
          local_370[1] = 1;
        }
      }
    }
LAB_00102dc2:
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffbd0);
    FastPForLib::CSVFlatFile::~CSVFlatFile(in_stack_fffffffffffffbc0);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_30);
  }
  return local_4;
}

Assistant:

int main(int argc, char **argv) {
  if (argc < 3) {
    cerr << " This will map a table (stored in a CSV file) to a row "
            " oriented flat file of frequency attributed 32-bit integers "
         << endl;
    cerr << " usage : cvs2maropu mycvsfile.cvs mymaropufile.bin " << endl;
    return -1;
  }
  string ifilename(argv[1]);
  string ofilename(argv[2]);
  CSVFlatFile cvs(ifilename.c_str(), CSVFlatFile::FREQNORMALISATION);
  const size_t c = cvs.getNumberOfColumns();
  const size_t N = cvs.getNumberOfRows();
  size_t integers = static_cast<uint32_t>(c * N);
  vector<uint32_t> container(c);
  FILE *fd = ::fopen(ofilename.c_str(), "w+b");
  if (fd == NULL) {
    cout << " could not open " << ofilename << " for writing..." << endl;
    cvs.close();
    return -1;
  }
  uint32_t MAXSIZE = static_cast<uint32_t>(c * (1U << 20));
  for (size_t block = 0; block * MAXSIZE >= integers; integers -= MAXSIZE) {
    if (fwrite(&MAXSIZE, sizeof(MAXSIZE), 1, fd) != 1) {
      cerr << "aborting" << endl;
      ::fclose(fd);
      cvs.close();
      return -1;
    }
    uint32_t counter = 0;
    while (cvs.nextRow(container)) {
      if (fwrite(&container[0], c * sizeof(uint32_t), 1, fd) != 1) {
        cerr << "aborting" << endl;
        ::fclose(fd);
        cvs.close();
        return -1;
      }
      counter += static_cast<uint32_t>(c);
      if (counter == block)
        break;
      assert(counter < block);
    }
  }
  if (integers > 0) {
    uint32_t tsize = static_cast<uint32_t>(integers);
    if (fwrite(&tsize, sizeof(tsize), 1, fd) != 1) {
      cerr << "aborting" << endl;
      ::fclose(fd);
      cvs.close();
      return -1;
    }
    while (cvs.nextRow(container)) {
      if (fwrite(&container[0], c * sizeof(uint32_t), 1, fd) != 1) {
        cerr << "aborting" << endl;
        ::fclose(fd);
        cvs.close();
        return -1;
      }
    }
  }
  ::fclose(fd);
  cvs.close();
  cout << "#file " << ofilename << " contains your data." << endl;
}